

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void test<unsigned_long>(bool shouldBeValid,string *value)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  byte bVar5;
  char cVar6;
  char cVar7;
  ulong uVar8;
  unsigned_long __val;
  bool shouldBeValid_local;
  AssertHelper local_60;
  AssertionResult gtest_ar_1;
  bool valid;
  AssertionResult gtest_ar;
  undefined1 local_30 [16];
  
  if (value->_M_string_length == 0) {
LAB_0011d5b7:
    valid = false;
    uVar8 = 0;
  }
  else {
    pcVar4 = (value->_M_dataplus)._M_p;
    if (*pcVar4 == '-') goto LAB_0011d5b7;
    pcVar2 = pcVar4 + value->_M_string_length;
    if (*pcVar4 == '+') {
      pcVar4 = pcVar4 + 1;
    }
    if (pcVar4 == pcVar2) goto LAB_0011d5b7;
    uVar8 = 0;
    do {
      if ((byte)(*pcVar4 - 0x3aU) < 0xf6) {
LAB_0011d9ca:
        valid = false;
        goto LAB_0011d623;
      }
      bVar5 = *pcVar4 - 0x30;
      if (0x1999999999999999 < uVar8) goto LAB_0011d9ca;
      if (uVar8 == 0x1999999999999999 && 5 < bVar5) {
        valid = false;
        uVar8 = 0x1999999999999999;
        goto LAB_0011d623;
      }
      uVar8 = (ulong)bVar5 + uVar8 * 10;
      pcVar4 = pcVar4 + 1;
    } while (pcVar4 < pcVar2);
    valid = true;
  }
LAB_0011d623:
  shouldBeValid_local = shouldBeValid;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar,"shouldBeValid","valid",&shouldBeValid_local,&valid);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if ((undefined8 *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) ==
        (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp",
               0xc,pcVar4);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (((CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) != 0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       ((long *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (shouldBeValid_local != true) {
    return;
  }
  if (uVar8 < 10) {
    cVar6 = '\x01';
  }
  else {
    uVar3 = uVar8;
    cVar7 = '\x04';
    do {
      cVar6 = cVar7;
      if (uVar3 < 100) {
        cVar6 = cVar6 + -2;
        goto LAB_0011d74c;
      }
      if (uVar3 < 1000) {
        cVar6 = cVar6 + -1;
        goto LAB_0011d74c;
      }
      if (uVar3 < 10000) goto LAB_0011d74c;
      bVar1 = 99999 < uVar3;
      uVar3 = uVar3 / 10000;
      cVar7 = cVar6 + '\x04';
    } while (bVar1);
    cVar6 = cVar6 + '\x01';
  }
LAB_0011d74c:
  gtest_ar._0_8_ = local_30;
  std::__cxx11::string::_M_construct((ulong)&gtest_ar,cVar6);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)gtest_ar._0_8_,(uint)gtest_ar.message_.ptr_,uVar8);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_1,"value","std::to_string(result)",value,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  if ((undefined1 *)gtest_ar._0_8_ != local_30) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp",
               0xe,pcVar4);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (((gtest_ar._0_8_ != 0) && (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (gtest_ar._0_8_ != 0)) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_1.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_1.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (value->_M_string_length != 0) {
    pcVar4 = (value->_M_dataplus)._M_p;
    if (*pcVar4 != '-') {
      pcVar2 = pcVar4 + value->_M_string_length;
      if (*pcVar4 == '+') {
        pcVar4 = pcVar4 + 1;
      }
      if (pcVar4 != pcVar2) {
        __val = 0;
        do {
          cVar7 = *pcVar4;
          pcVar4 = pcVar4 + 1;
          __val = (__val * 10 + (long)cVar7) - 0x30;
        } while (pcVar4 != pcVar2);
        if (__val < 10) {
          cVar7 = '\x01';
        }
        else {
          uVar8 = __val;
          cVar6 = '\x04';
          do {
            cVar7 = cVar6;
            if (uVar8 < 100) {
              cVar7 = cVar7 + -2;
              goto LAB_0011d82b;
            }
            if (uVar8 < 1000) {
              cVar7 = cVar7 + -1;
              goto LAB_0011d82b;
            }
            if (uVar8 < 10000) goto LAB_0011d82b;
            bVar1 = 99999 < uVar8;
            uVar8 = uVar8 / 10000;
            cVar6 = cVar7 + '\x04';
          } while (bVar1);
          cVar7 = cVar7 + '\x01';
        }
        goto LAB_0011d82b;
      }
    }
  }
  cVar7 = '\x01';
  __val = 0;
LAB_0011d82b:
  gtest_ar._0_8_ = local_30;
  std::__cxx11::string::_M_construct((ulong)&gtest_ar,cVar7);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)gtest_ar._0_8_,(uint)gtest_ar.message_.ptr_,__val);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_1,"value","std::to_string(result2)",value,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  if ((undefined1 *)gtest_ar._0_8_ != local_30) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp",
               0x10,pcVar4);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (((gtest_ar._0_8_ != 0) && (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (gtest_ar._0_8_ != 0)) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_1.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_1.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  return;
}

Assistant:

static void test(bool shouldBeValid, std::string const& value) {
  bool valid;
  T result = jsteemann::atoi<T>(value.c_str(), value.c_str() + value.size(), valid);
  ASSERT_EQ(shouldBeValid, valid);
  if (shouldBeValid) {
    ASSERT_EQ(value, std::to_string(result));
    T result2 = jsteemann::atoi_unchecked<T>(value.c_str(), value.c_str() + value.size());
    ASSERT_EQ(value, std::to_string(result2));
  }
}